

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thief.c
# Opt level: O2

void do_backstab(CHAR_DATA *ch,char *argument)

{
  short sVar1;
  ushort uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  CHAR_DATA *victim;
  OBJ_DATA *pOVar8;
  char *pcVar9;
  CClass *this;
  char *pcVar10;
  long lVar11;
  char buf [4608];
  char arg [4608];
  
  one_argument(argument,arg);
  iVar4 = get_skill(ch,(int)gsn_backstab);
  if (iVar4 < 2) {
    pcVar10 = "You don\'t know how to backstab.\n\r";
LAB_0038f94a:
    send_to_char(pcVar10,ch);
    return;
  }
  if (arg[0] == '\0') {
    pcVar10 = "Backstab whom?\n\r";
    goto LAB_0038f94a;
  }
  victim = get_char_room(ch,arg);
  if (victim == (CHAR_DATA *)0x0) {
    pcVar10 = "They aren\'t here.\n\r";
    goto LAB_0038f94a;
  }
  if ((ch->fighting != (CHAR_DATA *)0x0) || (victim->fighting != (CHAR_DATA *)0x0)) {
    pcVar10 = "You\'re facing the wrong end.\n\r";
    goto LAB_0038f94a;
  }
  if (victim == ch) {
    pcVar10 = "How can you sneak up on yourself?\n\r";
    goto LAB_0038f94a;
  }
  pOVar8 = get_eq_char(ch,0x10);
  if (pOVar8 == (OBJ_DATA *)0x0) {
    pcVar10 = "You must be wielding a weapon to backstab.\n\r";
    goto LAB_0038f94a;
  }
  if ((pOVar8->value[0] != 2) &&
     ((pOVar8 = get_eq_char(ch,0x12), pOVar8 == (OBJ_DATA *)0x0 || (pOVar8->value[0] != 2)))) {
    pcVar10 = "You must be wielding a dagger to backstab.\n\r";
    goto LAB_0038f94a;
  }
  bVar3 = is_safe(ch,victim);
  if (bVar3) {
    return;
  }
  bVar3 = check_sidestep(ch,victim,(int)gsn_backstab,0x5f);
  if (bVar3) {
    return;
  }
  if ((double)victim->hit < ((double)(int)victim->max_hit * 8.5) / 10.0) {
    act("$N is hurt and suspicious ... you can\'t sneak up.",ch,(void *)0x0,victim,3);
    return;
  }
  WAIT_STATE(ch,(int)skill_table[gsn_backstab].beats);
  iVar4 = number_percent();
  iVar5 = get_skill(ch,(int)gsn_backstab);
  if (iVar4 < iVar5) {
    check_improve(ch,(int)gsn_backstab,true,1);
    bVar3 = is_npc(ch);
    if (((!bVar3) && (bVar3 = is_npc(victim), !bVar3)) && (victim->fighting == (CHAR_DATA *)0x0)) {
      iVar4 = number_range(0,1);
      if (iVar4 == 0) {
        pcVar10 = "Die, %s you backstabbing fool!";
LAB_0038fb3a:
        pcVar9 = pers(ch,victim);
        sprintf(buf,pcVar10,pcVar9);
      }
      else if (iVar4 == 1) {
        pcVar10 = "Help! I\'m being backstabbed by %s!";
        goto LAB_0038fb3a;
      }
      do_myell(victim,buf,ch);
    }
    iVar5 = (int)ch->level;
    iVar4 = 0x177;
    if (iVar5 < 0x2f) {
      iVar4 = iVar5 * 10 + -0x5a;
    }
    if (iVar5 < 0x13) {
      iVar4 = 100;
    }
    one_hit_new(ch,victim,(int)gsn_backstab,false,false,0,iVar4,(char *)0x0);
  }
  else {
    check_improve(ch,(int)gsn_backstab,false,1);
    bVar3 = is_npc(ch);
    if (((!bVar3) && (bVar3 = is_npc(victim), !bVar3)) && (victim->fighting == (CHAR_DATA *)0x0)) {
      iVar4 = number_range(0,1);
      if (iVar4 == 0) {
        pcVar10 = "Die, %s you backstabbing fool!";
LAB_0038fbb0:
        pcVar9 = pers(ch,victim);
        sprintf(buf,pcVar10,pcVar9);
      }
      else if (iVar4 == 1) {
        pcVar10 = "Help! I\'m being backstabbed by %s!";
        goto LAB_0038fbb0;
      }
      do_myell(victim,buf,ch);
    }
    damage(ch,victim,0,(int)gsn_backstab,0,true);
  }
  sVar1 = ch->level;
  lVar11 = (long)gsn_dual_backstab;
  this = char_data::Class(ch);
  iVar4 = CClass::GetIndex(this);
  if (sVar1 < *(short *)(lVar11 * 0x60 + 0x4ab788 + (long)iVar4 * 2)) {
    return;
  }
  iVar4 = number_range(0,3);
  if (iVar4 == 0) {
    iVar4 = get_skill(ch,(int)gsn_dual_backstab);
    if (iVar4 == 100) {
      return;
    }
    check_improve(ch,(int)gsn_dual_backstab,false,1);
    return;
  }
  iVar4 = number_percent();
  iVar5 = get_skill(ch,(int)gsn_dual_backstab);
  if ((ch->level + iVar5) - (int)victim->level < iVar4) {
    iVar4 = 0;
    check_improve(ch,(int)gsn_dual_backstab,false,1);
    goto LAB_0038fd35;
  }
  iVar4 = dice(pOVar8->value[1],pOVar8->value[2]);
  iVar5 = get_skill(ch,(int)gsn_dual_backstab);
  uVar2 = ch->level;
  if ((short)uVar2 < 0x23) {
    iVar6 = 2;
    iVar7 = 4;
  }
  else {
    if (uVar2 < 0x28) {
      iVar6 = 2;
    }
    else {
      if (0x2c < uVar2) {
        iVar6 = 4;
        if (uVar2 < 0x32) {
          iVar7 = 6;
        }
        else {
          iVar7 = 7;
        }
        goto LAB_0038fd08;
      }
      iVar6 = 3;
    }
    iVar7 = 5;
  }
LAB_0038fd08:
  iVar6 = number_range(iVar6,iVar7);
  sVar1 = ch->damroll;
  iVar7 = get_skill(ch,(int)gsn_dual_backstab);
  iVar4 = (iVar7 * sVar1) / 100 + iVar6 * ((iVar5 * iVar4) / 100);
LAB_0038fd35:
  damage_old(ch,victim,iVar4,(int)gsn_dual_backstab,0,true);
  return;
}

Assistant:

void do_backstab(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	CHAR_DATA *victim;
	OBJ_DATA *obj;
	int dam;
	char buf[MAX_STRING_LENGTH];

	one_argument(argument, arg);

	if (get_skill(ch, gsn_backstab) < 2)
	{
		send_to_char("You don't know how to backstab.\n\r", ch);
		return;
	}

	if (arg[0] == '\0')
	{
		send_to_char("Backstab whom?\n\r", ch);
		return;
	}

	victim = get_char_room(ch, arg);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (ch->fighting != nullptr || victim->fighting)
	{
		send_to_char("You're facing the wrong end.\n\r", ch);
		return;
	}

	if (victim == ch)
	{
		send_to_char("How can you sneak up on yourself?\n\r", ch);
		return;
	}

	obj = get_eq_char(ch, WEAR_WIELD);

	if (!obj)
	{
		send_to_char("You must be wielding a weapon to backstab.\n\r", ch);
		return;
	}

	if (obj->value[0] != WEAPON_DAGGER)
	{
		obj = get_eq_char(ch, WEAR_DUAL_WIELD);

		if (obj == nullptr || obj->value[0] != WEAPON_DAGGER)
		{
			send_to_char("You must be wielding a dagger to backstab.\n\r", ch);
			return;
		}
	}

	if (is_safe(ch, victim))
		return;

	if (check_sidestep(ch, victim, gsn_backstab, 95))
		return;

	if (victim->hit < victim->max_hit * 8.5 / 10)
	{
		act("$N is hurt and suspicious ... you can't sneak up.", ch, nullptr, victim, TO_CHAR);
		return;
	}

	WAIT_STATE(ch, skill_table[gsn_backstab].beats);

	if (number_percent() < get_skill(ch, gsn_backstab))
	{
		check_improve(ch, gsn_backstab, true, 1);

		if (!is_npc(ch) && !is_npc(victim) && victim->fighting == nullptr)
		{
			switch (number_range(0, 1))
			{
				case 0:
					sprintf(buf, "Die, %s you backstabbing fool!", pers(ch, victim));
					break;
				case 1:
					sprintf(buf, "Help! I'm being backstabbed by %s!", pers(ch, victim));
					break;
			}

			do_myell(victim, buf, ch);
		}

		one_hit_new(ch, victim, gsn_backstab, HIT_NOSPECIALS, HIT_UNBLOCKABLE, HIT_NOADD, URANGE(100, (ch->level - 9) * 10, 375), nullptr);
	}
	else
	{
		check_improve(ch, gsn_backstab, false, 1);

		if (!is_npc(ch) && !is_npc(victim) && victim->fighting == nullptr)
		{
			switch (number_range(0, 1))
			{
				case 0:
					sprintf(buf, "Die, %s you backstabbing fool!", pers(ch, victim));
					break;
				case 1:
					sprintf(buf, "Help! I'm being backstabbed by %s!", pers(ch, victim));
					break;
			}

			do_myell(victim, buf, ch);
		}

		damage(ch, victim, 0, gsn_backstab, DAM_NONE, true);
	}

	if (ch->level < skill_table[gsn_dual_backstab].skill_level[ch->Class()->GetIndex()])
		return;

	if (number_range(0, 3) == 0)
	{
		if (get_skill(ch, gsn_dual_backstab) != 100)
			check_improve(ch, gsn_dual_backstab, false, 1);

		return;
	}

	if (number_percent() > (get_skill(ch, gsn_dual_backstab) + ch->level - victim->level))
	{
		check_improve(ch, gsn_dual_backstab, false, 1);
		dam = 0;
	}
	else
	{
		dam = dice(obj->value[1], obj->value[2]) * get_skill(ch, gsn_dual_backstab) / 100;

		if (ch->level < 35)
			dam *= number_range(2, 4);
		else if (ch->level < 40)
			dam *= number_range(2, 5);
		else if (ch->level < 45)
			dam *= number_range(3, 5);
		else if (ch->level < 50)
			dam *= number_range(4, 6);
		else
			dam *= number_range(4, 7);

		dam += (ch->damroll * get_skill(ch, gsn_dual_backstab) / 100);
	}

	damage_old(ch, victim, dam, gsn_dual_backstab, DAM_NONE, true);
}